

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bison.cpp
# Opt level: O3

int yyparse(CProgram **program)

{
  byte bVar1;
  short sVar2;
  YYLTYPE YVar3;
  int iVar4;
  int iVar5;
  YYSTYPE YVar6;
  int iVar7;
  YYSTYPE yyctx;
  long lVar8;
  size_t __n;
  YYSTYPE *pYVar9;
  uint uVar10;
  uint uVar11;
  YYSTYPE YVar12;
  long lVar13;
  ulong uVar14;
  YYLTYPE *__dest;
  YYSTYPE *__dest_00;
  ulong uVar15;
  YYLTYPE *pYVar16;
  char *s;
  bool bVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  char *yymsg;
  int local_1474;
  long local_1470;
  long yymsg_alloc;
  YYSTYPE *local_1460;
  YYLTYPE *local_1458;
  YYSTYPE *local_1450;
  char yymsgbuf [128];
  yy_state_t yyssa [200];
  YYSTYPE yyvsa [200];
  YYLTYPE yylsa [200];
  
  yymsg = yymsgbuf;
  yymsg_alloc = 0x80;
  yychar = -2;
  yylsa[0].first_column = yylloc.first_column;
  yylsa[0].first_line = yylloc.first_line;
  yylsa[0].last_line = yylloc.last_line;
  yylsa[0].last_column = yylloc.last_column;
  pYVar16 = yylsa;
  lVar13 = 200;
  yyctx.Program = (CProgram *)yyssa;
  pYVar9 = yyvsa;
  local_1474 = 0;
  uVar11 = 0;
  YVar12.Program = yyctx.Program;
  local_1460 = pYVar9;
  local_1458 = pYVar16;
  local_1450 = (YYSTYPE *)program;
  do {
    *yyctx.string = (byte)uVar11;
    YVar6 = YVar12;
    if (YVar12.MethodDeclaration + lVar13 + -1 <= yyctx.Program) {
      if (lVar13 < 10000) {
        lVar13 = lVar13 * 2;
        if (9999 < lVar13) {
          lVar13 = 10000;
        }
        program = (CProgram **)(lVar13 * 0x19 + 0x1e);
        YVar6.Program = (CProgram *)malloc((size_t)program);
        if ((CMethod *)YVar6.Program != (CMethod *)0x0) {
          lVar8 = (long)yyctx.Program - (long)YVar12;
          __n = lVar8 + 1;
          memcpy(YVar6.Program,YVar12.Program,__n);
          uVar15 = lVar13 + 0x1e;
          if (-1 < (long)(lVar13 + 0xfU)) {
            uVar15 = lVar13 + 0xfU;
          }
          __dest_00 = (YYSTYPE *)
                      ((long)&((YVar6.Program)->super_IWrapper).super_PositionedNode.super_INode.
                              _vptr_INode + (uVar15 & 0xfffffffffffffff0));
          memcpy(__dest_00,local_1460,__n * 8);
          uVar15 = lVar13 * 8 + 0xf;
          uVar14 = lVar13 * 8 + 0x1e;
          if (-1 < (long)uVar15) {
            uVar14 = uVar15;
          }
          __dest = (YYLTYPE *)((uVar14 & 0xfffffffffffffff0) + (long)__dest_00);
          local_1470 = lVar13;
          memcpy(__dest,local_1458,__n * 0x10);
          if ((CMethod *)YVar12.Program != (CMethod *)yyssa) {
            free(YVar12.Program);
          }
          if ((long)__n < local_1470) {
            yyctx.Program = (CProgram *)(lVar8 + (long)YVar6.Program);
            pYVar9 = __dest_00 + lVar8;
            pYVar16 = __dest + lVar8;
            program = (CProgram **)YVar12;
            lVar13 = local_1470;
            local_1460 = __dest_00;
            local_1458 = __dest;
            goto LAB_00158b0e;
          }
          iVar7 = 1;
          goto LAB_0015957a;
        }
      }
LAB_0015941f:
      YVar6 = YVar12;
      yyerror(program,"memory exhausted");
      iVar7 = 2;
      goto LAB_0015956a;
    }
LAB_00158b0e:
    if (uVar11 == 6) {
      iVar7 = 0;
      goto LAB_0015956a;
    }
    sVar2 = yypact[uVar11];
    YVar12 = YVar6;
    if (sVar2 != -0x76) {
      if (yychar == -2) {
        yychar = yylex();
      }
      if (yychar < 1) {
        yychar = 0;
        iVar7 = 0;
      }
      else {
        if (yychar == 0x100) {
          yychar = 0x101;
LAB_0015955f:
          for (; yyctx.Program != YVar6.Program;
              yyctx = (YYSTYPE)((long)&yyctx.Program[-1].classList._M_t.
                                       super___uniq_ptr_impl<CClassList,_std::default_delete<CClassList>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_CClassList_*,_std::default_delete<CClassList>_>
                                       .super__Head_base<0UL,_CClassList_*,_false>._M_head_impl + 7)
              ) {
          }
LAB_00159564:
          iVar7 = 1;
LAB_0015956a:
          if ((CMethod *)YVar6.Program != (CMethod *)yyssa) {
LAB_0015957a:
            free(YVar6.Program);
          }
          if (yymsg != yymsgbuf) {
            free(yymsg);
          }
          return iVar7;
        }
        iVar7 = 2;
        if ((uint)yychar < 300) {
          iVar7 = (int)""[(uint)yychar];
        }
      }
      uVar10 = sVar2 + iVar7;
      if ((0x144 < uVar10) || (iVar7 != yycheck[uVar10])) goto LAB_00158bf6;
      bVar1 = yytable[uVar10];
      if (bVar1 == 0) {
        iVar7 = 0;
        goto LAB_00158c0a;
      }
      bVar17 = local_1474 == 0;
      local_1474 = local_1474 + -1;
      if (bVar17) {
        local_1474 = 0;
      }
      pYVar9[1] = yylval;
      YVar3.first_column = yylloc.first_column;
      YVar3.first_line = yylloc.first_line;
      YVar3.last_line = yylloc.last_line;
      YVar3.last_column = yylloc.last_column;
      pYVar16[1] = YVar3;
      yychar = -2;
      goto LAB_001593df;
    }
LAB_00158bf6:
    iVar7 = (int)""[uVar11];
    if (""[uVar11] == '\0') {
      if (local_1474 == 3) {
        if (0 < yychar) {
          yychar = -2;
          goto LAB_0015955f;
        }
        if (yychar == 0) goto LAB_00159564;
        goto LAB_0015955f;
      }
      if (local_1474 != 0) goto LAB_0015955f;
      yynerrs = yynerrs + 1;
      program = (CProgram **)&yymsg_alloc;
      iVar7 = yysyntax_error((long *)program,&yymsg,(yypcontext_t *)yyctx.Program);
      if (iVar7 == -1) {
        if (yymsg != yymsgbuf) {
          free(yymsg);
        }
        program = (CProgram **)yymsg_alloc;
        s = (char *)malloc(yymsg_alloc);
        if (s == (char *)0x0) {
          yymsg_alloc = 0x80;
          yymsg = yymsgbuf;
          yyerror(program,"syntax error");
          goto LAB_0015941f;
        }
        program = (CProgram **)&yymsg_alloc;
        yymsg = s;
        iVar7 = yysyntax_error((long *)program,&yymsg,(yypcontext_t *)yyctx.Program);
      }
      else {
        if (iVar7 == 0) {
          yyerror(program,yymsg);
          goto LAB_0015955f;
        }
        s = "syntax error";
      }
      yyerror(program,s);
      if (iVar7 == -2) goto LAB_0015941f;
      goto LAB_0015955f;
    }
LAB_00158c0a:
    uVar15 = (ulong)iVar7;
    lVar8 = (long)""[uVar15];
    if ((0x200000002804821U >> (uVar15 & 0x3f) & 1) == 0) {
      iVar18 = pYVar16[1 - lVar8].first_line;
      iVar19 = pYVar16[1 - lVar8].first_column;
      iVar20 = pYVar16[1].first_line;
      iVar21 = pYVar16[1].first_column;
    }
    else {
      iVar18 = pYVar16->last_line;
      iVar19 = pYVar16->last_column;
      iVar20 = iVar18;
      iVar21 = iVar19;
    }
    local_1470 = lVar13;
    switch(iVar7) {
    case 2:
      YVar6.Program = (CProgram *)operator_new(0x28);
      program = (CProgram **)YVar6.Program;
      CProgram::CProgram(YVar6.Program,pYVar9[-1].MainClass,pYVar9->ClassDeclarationList);
      local_1450->Program = (CProgram *)YVar6;
      break;
    case 3:
      YVar6.Program = (CProgram *)operator_new(0x28);
      program = (CProgram **)YVar6.Program;
      CMainClass::CMainClass(YVar6.MainClass,pYVar9[-3].Identifier,pYVar9[-1].MainMethod);
      break;
    case 4:
      YVar6.Program = (CProgram *)operator_new(0x38);
      program = (CProgram **)YVar6.Program;
      CMainMethod::CMainMethod
                (YVar6.MainMethod,(CType *)0x0,pYVar9[-5].Identifier,pYVar9[-2].VarDeclarationList,
                 (CCompoundStm *)pYVar9[-1].Program);
      break;
    case 5:
      YVar6.Program = (CProgram *)operator_new(0x30);
      program = (CProgram **)YVar6.Program;
      CClassList::CClassList(YVar6.ClassDeclarationList);
      break;
    case 6:
      YVar6 = (YYSTYPE)pYVar9[-1].ClassDeclarationList;
      program = (CProgram **)YVar6;
      CClassList::Add(YVar6.ClassDeclarationList,pYVar9->Class);
      break;
    case 7:
      YVar6.Program = (CProgram *)operator_new(0x38);
      program = (CProgram **)YVar6.Program;
      CClass::CClass(YVar6.Class,pYVar9[-4].Identifier,(CIdExp *)0x0,pYVar9[-2].VarDeclarationList,
                     pYVar9[-1].MethodDeclarationList);
      break;
    case 8:
      YVar6.Program = (CProgram *)operator_new(0x38);
      program = (CProgram **)YVar6.Program;
      CClass::CClass(YVar6.Class,pYVar9[-6].Identifier,pYVar9[-4].Identifier,
                     pYVar9[-2].VarDeclarationList,pYVar9[-1].MethodDeclarationList);
      break;
    case 9:
      YVar6.Program = (CProgram *)operator_new(0x50);
      program = (CProgram **)YVar6.Program;
      CMethod::CMethod(YVar6.MethodDeclaration,pYVar9[-0xb].Type,pYVar9[-2].Expression,
                       pYVar9[-10].Identifier,pYVar9[-8].ArgumentList,pYVar9[-5].VarDeclarationList,
                       (CCompoundStm *)pYVar9[-4].Program,true);
      break;
    case 10:
      YVar6.Program = (CProgram *)operator_new(0x50);
      program = (CProgram **)YVar6.Program;
      CMethod::CMethod(YVar6.MethodDeclaration,pYVar9[-0xb].Type,pYVar9[-2].Expression,
                       pYVar9[-10].Identifier,pYVar9[-8].ArgumentList,pYVar9[-5].VarDeclarationList,
                       (CCompoundStm *)pYVar9[-4].Program,false);
      break;
    case 0xb:
      YVar6.Program = (CProgram *)operator_new(0x30);
      program = (CProgram **)YVar6.Program;
      CMethodList::CMethodList(YVar6.MethodDeclarationList);
      break;
    case 0xc:
      YVar6 = (YYSTYPE)pYVar9[-1].MethodDeclarationList;
      program = (CProgram **)YVar6;
      CMethodList::Add(YVar6.MethodDeclarationList,pYVar9->MethodDeclaration);
      break;
    case 0xd:
      (pYVar9[-1].Identifier)->isInstance = true;
      YVar6.Program = (CProgram *)operator_new(0x28);
      program = (CProgram **)YVar6.Program;
      CField::CField(YVar6.VarDeclaration,pYVar9[-2].Type,pYVar9[-1].Identifier);
      break;
    case 0xe:
      YVar6.Program = (CProgram *)operator_new(0x30);
      program = (CProgram **)YVar6.Program;
      CFieldList::CFieldList(YVar6.VarDeclarationList);
      break;
    case 0xf:
      YVar6 = (YYSTYPE)pYVar9[-1].VarDeclarationList;
      program = (CProgram **)YVar6;
      CFieldList::Add(YVar6.VarDeclarationList,pYVar9->VarDeclaration);
      break;
    case 0x10:
      pYVar9->Identifier->isInstance = true;
      YVar6.Program = (CProgram *)operator_new(0x28);
      program = (CProgram **)YVar6.Program;
      CArgument::CArgument(YVar6.Argument,pYVar9[-1].Type,pYVar9->Identifier);
      break;
    case 0x11:
      YVar6.Program = (CProgram *)operator_new(0x28);
      program = (CProgram **)YVar6.Program;
      CType::CType(YVar6.Type,INT_ARRAY);
      goto LAB_00159341;
    case 0x12:
      YVar6.Program = (CProgram *)operator_new(0x28);
      program = (CProgram **)YVar6.Program;
      CType::CType(YVar6.Type,BOOLEAN);
      goto LAB_00159341;
    case 0x13:
      YVar6.Program = (CProgram *)operator_new(0x28);
      program = (CProgram **)YVar6.Program;
      CType::CType(YVar6.Type,INT);
      goto LAB_00159341;
    case 0x14:
      YVar6.Program = (CProgram *)operator_new(0x28);
      program = (CProgram **)YVar6.Program;
      CType::CType(YVar6.Type,pYVar9->Identifier);
      break;
    case 0x15:
      YVar6.Program = (CProgram *)operator_new(0x30);
      program = (CProgram **)YVar6.Program;
      CArgumentList::CArgumentList(YVar6.ArgumentList,pYVar9->Argument);
      break;
    case 0x16:
      YVar6 = (YYSTYPE)pYVar9[-2].ArgumentList;
      program = (CProgram **)YVar6;
      CArgumentList::Add(YVar6.ArgumentList,pYVar9->Argument);
      break;
    case 0x17:
      YVar6.Program = (CProgram *)operator_new(0x30);
      program = (CProgram **)YVar6.Program;
      CArgumentList::CArgumentList(YVar6.ArgumentList);
      break;
    case 0x19:
      YVar6.Program = (CProgram *)operator_new(0x28);
      program = (CProgram **)YVar6.Program;
      CCompoundStm::CCompoundStm((CCompoundStm *)YVar6.Program,(IStatement *)0x0,(IStatement *)0x0);
      break;
    case 0x1a:
      YVar6.Program = (CProgram *)operator_new(0x28);
      program = (CProgram **)YVar6.Program;
      CCompoundStm::CCompoundStm
                ((CCompoundStm *)YVar6.Program,pYVar9[-1].Statement,pYVar9->Statement);
      break;
    case 0x1b:
    case 0x34:
      YVar6 = pYVar9[-1];
      break;
    case 0x1c:
      YVar6.Program = (CProgram *)operator_new(0x30);
      program = (CProgram **)YVar6.Program;
      CIfStm::CIfStm((CIfStm *)YVar6.Program,pYVar9[-4].Expression,pYVar9[-2].Statement,
                     pYVar9->Statement);
      break;
    case 0x1d:
      YVar6.Program = (CProgram *)operator_new(0x28);
      program = (CProgram **)YVar6.Program;
      CWhileStm::CWhileStm((CWhileStm *)YVar6.Program,pYVar9[-2].Expression,pYVar9->Statement);
      break;
    case 0x1e:
      YVar6.Program = (CProgram *)operator_new(0x20);
      program = (CProgram **)YVar6.Program;
      CPrintStm::CPrintStm((CPrintStm *)YVar6.Program,pYVar9[-2].Expression);
      break;
    case 0x1f:
      (pYVar9[-3].Identifier)->isInstance = true;
      YVar6.Program = (CProgram *)operator_new(0x28);
      program = (CProgram **)YVar6.Program;
      CAssignStm::CAssignStm
                ((CAssignStm *)YVar6.Program,pYVar9[-3].Identifier,pYVar9[-1].Expression);
      break;
    case 0x20:
      (pYVar9[-6].Identifier)->isInstance = true;
      YVar6.Program = (CProgram *)operator_new(0x30);
      program = (CProgram **)YVar6.Program;
      CAssignSubscriptStm::CAssignSubscriptStm
                ((CAssignSubscriptStm *)YVar6.Program,pYVar9[-6].Identifier,pYVar9[-4].Expression,
                 pYVar9[-1].Expression);
      break;
    case 0x21:
      YVar6.Program = (CProgram *)operator_new(0x30);
      program = (CProgram **)YVar6.Program;
      COpExp::COpExp((COpExp *)YVar6.Program,pYVar9[-2].Expression,pYVar9->Expression,PLUS);
      break;
    case 0x22:
      YVar6.Program = (CProgram *)operator_new(0x30);
      program = (CProgram **)YVar6.Program;
      COpExp::COpExp((COpExp *)YVar6.Program,pYVar9[-2].Expression,pYVar9->Expression,MINUS);
      break;
    case 0x23:
      YVar6.Program = (CProgram *)operator_new(0x30);
      program = (CProgram **)YVar6.Program;
      COpExp::COpExp((COpExp *)YVar6.Program,pYVar9[-2].Expression,pYVar9->Expression,MULTIPLY);
      break;
    case 0x24:
      YVar6.Program = (CProgram *)operator_new(0x30);
      program = (CProgram **)YVar6.Program;
      CLogOpExp::CLogOpExp((CLogOpExp *)YVar6.Program,pYVar9[-2].Expression,pYVar9->Expression,AND);
      break;
    case 0x25:
      YVar6.Program = (CProgram *)operator_new(0x30);
      program = (CProgram **)YVar6.Program;
      CLogOpExp::CLogOpExp((CLogOpExp *)YVar6.Program,pYVar9[-2].Expression,pYVar9->Expression,OR);
      break;
    case 0x26:
      YVar6.Program = (CProgram *)operator_new(0x30);
      program = (CProgram **)YVar6.Program;
      CCompExp::CCompExp((CCompExp *)YVar6.Program,pYVar9[-2].Expression,pYVar9->Expression,LESS);
      break;
    case 0x27:
      YVar6.Program = (CProgram *)operator_new(0x30);
      program = (CProgram **)YVar6.Program;
      CCompExp::CCompExp((CCompExp *)YVar6.Program,pYVar9[-2].Expression,pYVar9->Expression,GREATER)
      ;
      break;
    case 0x28:
      YVar6.Program = (CProgram *)operator_new(0x30);
      program = (CProgram **)YVar6.Program;
      COpExp::COpExp((COpExp *)YVar6.Program,pYVar9[-2].Expression,pYVar9->Expression,MOD);
      break;
    case 0x29:
      YVar6.Program = (CProgram *)operator_new(0x28);
      program = (CProgram **)YVar6.Program;
      CByIndexExpression::CByIndexExpression
                ((CByIndexExpression *)YVar6.Program,pYVar9[-3].Expression,pYVar9[-1].Expression);
      break;
    case 0x2a:
      YVar6.Program = (CProgram *)operator_new(0x20);
      program = (CProgram **)YVar6.Program;
      CGetLengthExp::CGetLengthExp((CGetLengthExp *)YVar6.Program,pYVar9[-2].Expression);
      break;
    case 0x2b:
      YVar6.Program = (CProgram *)operator_new(0x30);
      program = (CProgram **)YVar6.Program;
      CCallMethodExp::CCallMethodExp
                ((CCallMethodExp *)YVar6.Program,pYVar9[-5].Expression,pYVar9[-3].Identifier,
                 pYVar9[-1].ExpressionList);
      break;
    case 0x2c:
      pYVar9->Identifier->isInstance = true;
      YVar6.Program = (CProgram *)operator_new(0x20);
      program = (CProgram **)YVar6.Program;
      CGetFieldByThisExpression::CGetFieldByThisExpression
                ((CGetFieldByThisExpression *)YVar6.Program,pYVar9->Identifier);
      break;
    case 0x2d:
      YVar6.Program = (CProgram *)operator_new(0x20);
      program = (CProgram **)YVar6.Program;
      CUnarMinusExp::CUnarMinusExp((CUnarMinusExp *)YVar6.Program,pYVar9->Expression);
      break;
    case 0x2e:
      YVar6.Program = (CProgram *)operator_new(0x20);
      program = (CProgram **)YVar6.Program;
      CNumExp::CNumExp((CNumExp *)YVar6.Program,pYVar9->string);
      goto LAB_00159341;
    case 0x2f:
      YVar6.Program = (CProgram *)operator_new(0x20);
      program = (CProgram **)YVar6.Program;
      CLogExp::CLogExp((CLogExp *)YVar6.Program,true);
      goto LAB_00159341;
    case 0x30:
      YVar6.Program = (CProgram *)operator_new(0x20);
      program = (CProgram **)YVar6.Program;
      CLogExp::CLogExp((CLogExp *)YVar6.Program,false);
      goto LAB_00159341;
    case 0x31:
      pYVar9->Identifier->isInstance = true;
    case 0x18:
    case 0x3a:
      YVar6 = *pYVar9;
      break;
    case 0x32:
      YVar6.Program = (CProgram *)operator_new(0x20);
      program = (CProgram **)YVar6.Program;
      CNewArrayExpression::CNewArrayExpression
                ((CNewArrayExpression *)YVar6.Program,pYVar9[-1].Expression);
      break;
    case 0x33:
      YVar6.Program = (CProgram *)operator_new(0x20);
      program = (CProgram **)YVar6.Program;
      CNewIdentifier::CNewIdentifier((CNewIdentifier *)YVar6.Program,pYVar9[-2].Identifier);
      break;
    case 0x35:
      YVar6.Program = (CProgram *)operator_new(0x18);
      program = (CProgram **)YVar6.Program;
      CThisExpression::CThisExpression((CThisExpression *)YVar6.Program);
      goto LAB_00159341;
    case 0x36:
      YVar6.Program = (CProgram *)operator_new(0x20);
      program = (CProgram **)YVar6.Program;
      CNegativeExpression::CNegativeExpression
                ((CNegativeExpression *)YVar6.Program,pYVar9->Expression);
      break;
    case 0x37:
      YVar6.Program = (CProgram *)operator_new(0x30);
      program = (CProgram **)YVar6.Program;
      CExpList::CExpList(YVar6.ExpressionList,pYVar9->Expression);
      break;
    case 0x38:
      YVar6 = (YYSTYPE)pYVar9[-2].ExpressionList;
      program = (CProgram **)YVar6;
      CExpList::Add(YVar6.ExpressionList,pYVar9->Expression);
      break;
    case 0x39:
      YVar6.Program = (CProgram *)operator_new(0x30);
      program = (CProgram **)YVar6.Program;
      CExpList::CExpList(YVar6.ExpressionList);
      break;
    case 0x3b:
      YVar6.Program = (CProgram *)operator_new(0x40);
      program = (CProgram **)YVar6.Program;
      CIdExp::CIdExp(YVar6.Identifier,pYVar9->string);
LAB_00159341:
      iVar5 = yylloc.last_column;
      iVar4 = yylloc.last_line;
      iVar7 = yylloc.first_column;
      ((YVar6.Program)->super_IWrapper).super_PositionedNode.position.firstLine = yylloc.first_line;
      ((YVar6.Program)->super_IWrapper).super_PositionedNode.position.lastLine = iVar4;
      ((YVar6.Program)->super_IWrapper).super_PositionedNode.position.firstColumn = iVar7;
      ((YVar6.Program)->super_IWrapper).super_PositionedNode.position.lastColumn = iVar5;
      break;
    default:
      YVar6 = pYVar9[1 - lVar8];
    }
    pYVar9 = pYVar9 + -lVar8;
    yyctx.Program = yyctx.Program - lVar8;
    pYVar16 = pYVar16 + -lVar8;
    pYVar9[1] = YVar6;
    pYVar16[1].first_line = iVar18;
    pYVar16[1].first_column = iVar19;
    pYVar16[1].last_line = iVar20;
    pYVar16[1].last_column = iVar21;
    uVar11 = (int)*(short *)("" + (long)""[uVar15] * 2 + 0x26) + (uint)(byte)*yyctx.string;
    if ((uVar11 < 0x145) &&
       (program._4_4_ = 0, program._0_4_ = uVar11,
       (int)yycheck[(long)program] == (uint)(byte)*yyctx.string)) {
      YVar6.Program = (CProgram *)((long)program + 0x15ff90);
      program = (CProgram **)YVar6.Program;
    }
    else {
      YVar6.Program = (CProgram *)((long)yypgoto + (long)""[uVar15] + 3);
    }
    bVar1 = *YVar6.string;
    lVar13 = local_1470;
LAB_001593df:
    uVar11 = (uint)bVar1;
    pYVar16 = pYVar16 + 1;
    pYVar9 = pYVar9 + 1;
    yyctx.Program =
         (CProgram *)
         ((long)&((yyctx.Program)->super_IWrapper).super_PositionedNode.super_INode._vptr_INode + 1)
    ;
  } while( true );
}

Assistant:

int
yyparse (CProgram** program)
{
    yy_state_fast_t yystate = 0;
    /* Number of tokens to shift before error messages enabled.  */
    int yyerrstatus = 0;

    /* Refer to the stacks through separate pointers, to allow yyoverflow
       to reallocate them elsewhere.  */

    /* Their size.  */
    YYPTRDIFF_T yystacksize = YYINITDEPTH;

    /* The state stack: array, bottom, top.  */
    yy_state_t yyssa[YYINITDEPTH];
    yy_state_t *yyss = yyssa;
    yy_state_t *yyssp = yyss;

    /* The semantic value stack: array, bottom, top.  */
    YYSTYPE yyvsa[YYINITDEPTH];
    YYSTYPE *yyvs = yyvsa;
    YYSTYPE *yyvsp = yyvs;

    /* The location stack: array, bottom, top.  */
    YYLTYPE yylsa[YYINITDEPTH];
    YYLTYPE *yyls = yylsa;
    YYLTYPE *yylsp = yyls;

  int yyn;
  /* The return value of yyparse.  */
  int yyresult;
  /* Lookahead symbol kind.  */
  yysymbol_kind_t yytoken = YYSYMBOL_YYEMPTY;
  /* The variables used to return semantic value and location from the
     action routines.  */
  YYSTYPE yyval;
  YYLTYPE yyloc;

  /* The locations where the error started and ended.  */
  YYLTYPE yyerror_range[3];

  /* Buffer for error messages, and its allocated size.  */
  char yymsgbuf[128];
  char *yymsg = yymsgbuf;
  YYPTRDIFF_T yymsg_alloc = sizeof yymsgbuf;

#define YYPOPSTACK(N)   (yyvsp -= (N), yyssp -= (N), yylsp -= (N))

  /* The number of symbols on the RHS of the reduced rule.
     Keep to zero when no symbol should be popped.  */
  int yylen = 0;

  YYDPRINTF ((stderr, "Starting parse\n"));

  yychar = YYEMPTY; /* Cause a token to be read.  */

  yylsp[0] = yylloc;
  goto yysetstate;


/*------------------------------------------------------------.
| yynewstate -- push a new state, which is found in yystate.  |
`------------------------------------------------------------*/
yynewstate:
  /* In all cases, when you get here, the value and location stacks
     have just been pushed.  So pushing a state here evens the stacks.  */
  yyssp++;


/*--------------------------------------------------------------------.
| yysetstate -- set current state (the top of the stack) to yystate.  |
`--------------------------------------------------------------------*/
yysetstate:
  YYDPRINTF ((stderr, "Entering state %d\n", yystate));
  YY_ASSERT (0 <= yystate && yystate < YYNSTATES);
  YY_IGNORE_USELESS_CAST_BEGIN
  *yyssp = YY_CAST (yy_state_t, yystate);
  YY_IGNORE_USELESS_CAST_END
  YY_STACK_PRINT (yyss, yyssp);

  if (yyss + yystacksize - 1 <= yyssp)
#if !defined yyoverflow && !defined YYSTACK_RELOCATE
    YYNOMEM;
#else
    {
      /* Get the current used size of the three stacks, in elements.  */
      YYPTRDIFF_T yysize = yyssp - yyss + 1;

# if defined yyoverflow
      {
        /* Give user a chance to reallocate the stack.  Use copies of
           these so that the &'s don't force the real ones into
           memory.  */
        yy_state_t *yyss1 = yyss;
        YYSTYPE *yyvs1 = yyvs;
        YYLTYPE *yyls1 = yyls;

        /* Each stack pointer address is followed by the size of the
           data in use in that stack, in bytes.  This used to be a
           conditional around just the two extra args, but that might
           be undefined if yyoverflow is a macro.  */
        yyoverflow (YY_("memory exhausted"),
                    &yyss1, yysize * YYSIZEOF (*yyssp),
                    &yyvs1, yysize * YYSIZEOF (*yyvsp),
                    &yyls1, yysize * YYSIZEOF (*yylsp),
                    &yystacksize);
        yyss = yyss1;
        yyvs = yyvs1;
        yyls = yyls1;
      }
# else /* defined YYSTACK_RELOCATE */
      /* Extend the stack our own way.  */
      if (YYMAXDEPTH <= yystacksize)
        YYNOMEM;
      yystacksize *= 2;
      if (YYMAXDEPTH < yystacksize)
        yystacksize = YYMAXDEPTH;

      {
        yy_state_t *yyss1 = yyss;
        union yyalloc *yyptr =
          YY_CAST (union yyalloc *,
                   YYSTACK_ALLOC (YY_CAST (YYSIZE_T, YYSTACK_BYTES (yystacksize))));
        if (! yyptr)
          YYNOMEM;
        YYSTACK_RELOCATE (yyss_alloc, yyss);
        YYSTACK_RELOCATE (yyvs_alloc, yyvs);
        YYSTACK_RELOCATE (yyls_alloc, yyls);
#  undef YYSTACK_RELOCATE
        if (yyss1 != yyssa)
          YYSTACK_FREE (yyss1);
      }
# endif

      yyssp = yyss + yysize - 1;
      yyvsp = yyvs + yysize - 1;
      yylsp = yyls + yysize - 1;

      YY_IGNORE_USELESS_CAST_BEGIN
      YYDPRINTF ((stderr, "Stack size increased to %ld\n",
                  YY_CAST (long, yystacksize)));
      YY_IGNORE_USELESS_CAST_END

      if (yyss + yystacksize - 1 <= yyssp)
        YYABORT;
    }
#endif /* !defined yyoverflow && !defined YYSTACK_RELOCATE */


  if (yystate == YYFINAL)
    YYACCEPT;

  goto yybackup;


/*-----------.
| yybackup.  |
`-----------*/
yybackup:
  /* Do appropriate processing given the current state.  Read a
     lookahead token if we need one and don't already have one.  */

  /* First try to decide what to do without reference to lookahead token.  */
  yyn = yypact[yystate];
  if (yypact_value_is_default (yyn))
    goto yydefault;

  /* Not known => get a lookahead token if don't already have one.  */

  /* YYCHAR is either empty, or end-of-input, or a valid lookahead.  */
  if (yychar == YYEMPTY)
    {
      YYDPRINTF ((stderr, "Reading a token\n"));
      yychar = yylex ();
    }

  if (yychar <= YYEOF)
    {
      yychar = YYEOF;
      yytoken = YYSYMBOL_YYEOF;
      YYDPRINTF ((stderr, "Now at end of input.\n"));
    }
  else if (yychar == YYerror)
    {
      /* The scanner already issued an error message, process directly
         to error recovery.  But do not keep the error token as
         lookahead, it is too special and may lead us to an endless
         loop in error recovery. */
      yychar = YYUNDEF;
      yytoken = YYSYMBOL_YYerror;
      yyerror_range[1] = yylloc;
      goto yyerrlab1;
    }
  else
    {
      yytoken = YYTRANSLATE (yychar);
      YY_SYMBOL_PRINT ("Next token is", yytoken, &yylval, &yylloc);
    }

  /* If the proper action on seeing token YYTOKEN is to reduce or to
     detect an error, take that action.  */
  yyn += yytoken;
  if (yyn < 0 || YYLAST < yyn || yycheck[yyn] != yytoken)
    goto yydefault;
  yyn = yytable[yyn];
  if (yyn <= 0)
    {
      if (yytable_value_is_error (yyn))
        goto yyerrlab;
      yyn = -yyn;
      goto yyreduce;
    }

  /* Count tokens shifted since error; after three, turn off error
     status.  */
  if (yyerrstatus)
    yyerrstatus--;

  /* Shift the lookahead token.  */
  YY_SYMBOL_PRINT ("Shifting", yytoken, &yylval, &yylloc);
  yystate = yyn;
  YY_IGNORE_MAYBE_UNINITIALIZED_BEGIN
  *++yyvsp = yylval;
  YY_IGNORE_MAYBE_UNINITIALIZED_END
  *++yylsp = yylloc;

  /* Discard the shifted token.  */
  yychar = YYEMPTY;
  goto yynewstate;


/*-----------------------------------------------------------.
| yydefault -- do the default action for the current state.  |
`-----------------------------------------------------------*/
yydefault:
  yyn = yydefact[yystate];
  if (yyn == 0)
    goto yyerrlab;
  goto yyreduce;


/*-----------------------------.
| yyreduce -- do a reduction.  |
`-----------------------------*/
yyreduce:
  /* yyn is the number of a rule to reduce with.  */
  yylen = yyr2[yyn];

  /* If YYLEN is nonzero, implement the default value of the action:
     '$$ = $1'.

     Otherwise, the following line sets YYVAL to garbage.
     This behavior is undocumented and Bison
     users should not rely upon it.  Assigning to YYVAL
     unconditionally makes the parser a bit smaller, and it avoids a
     GCC warning that YYVAL may be used uninitialized.  */
  yyval = yyvsp[1-yylen];

  /* Default location. */
  YYLLOC_DEFAULT (yyloc, (yylsp - yylen), yylen);
  yyerror_range[1] = yyloc;
  YY_REDUCE_PRINT (yyn);
  switch (yyn)
    {
  case 2: /* Program: MainClass ClassDeclarationList  */
#line 124 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                       { 
		*program = (yyval.Program) = new CProgram( (yyvsp[-1].MainClass), (yyvsp[0].ClassDeclarationList) );
	}
#line 1649 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 3: /* MainClass: CLASS Identifier LBRACE MainMethod RBRACE  */
#line 133 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
        {	
		(yyval.MainClass) = new CMainClass( (yyvsp[-3].Identifier), (yyvsp[-1].MainMethod) );
	}
#line 1657 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 4: /* MainMethod: PUBLIC STATIC VOID MAIN LPAREN STRING LBRACKET RBRACKET Identifier RPAREN LBRACE VarDeclarationList StatementList RBRACE  */
#line 144 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
        {	
		(yyval.MainMethod) = new CMainMethod( 0, (yyvsp[-5].Identifier), (CFieldList *) (yyvsp[-2].VarDeclarationList),(CCompoundStm *)(yyvsp[-1].Statement) );
	}
#line 1665 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 5: /* ClassDeclarationList: %empty  */
#line 150 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
               { 
		(yyval.ClassDeclarationList) = new CClassList();
	}
#line 1673 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 6: /* ClassDeclarationList: ClassDeclarationList Class  */
#line 154 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                   { (yyval.ClassDeclarationList) = (yyvsp[-1].ClassDeclarationList); (yyvsp[-1].ClassDeclarationList)->Add((yyvsp[0].Class)); }
#line 1679 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 7: /* Class: CLASS Identifier LBRACE VarDeclarationList MethodDeclarationList RBRACE  */
#line 161 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
               { 
		(yyval.Class) = new CClass( (yyvsp[-4].Identifier), 0, (yyvsp[-2].VarDeclarationList), (yyvsp[-1].MethodDeclarationList) );
	}
#line 1687 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 8: /* Class: CLASS Identifier EXTENDS Identifier LBRACE VarDeclarationList MethodDeclarationList RBRACE  */
#line 168 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
               { 
		(yyval.Class) = new CClass( (yyvsp[-6].Identifier), (yyvsp[-4].Identifier), (yyvsp[-2].VarDeclarationList), (yyvsp[-1].MethodDeclarationList) );
	}
#line 1695 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 9: /* MethodDeclaration: PUBLIC Type Identifier LPAREN ArgumentList RPAREN LBRACE VarDeclarationList StatementList RETURN Expression SEMI RBRACE  */
#line 180 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
        { 
		(yyval.MethodDeclaration) = new CMethod( (yyvsp[-11].Type), (yyvsp[-2].Expression), (yyvsp[-10].Identifier), (yyvsp[-8].ArgumentList), (CFieldList *)(yyvsp[-5].VarDeclarationList),(CCompoundStm *)(yyvsp[-4].Statement), true );
	}
#line 1703 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 10: /* MethodDeclaration: PRIVATE Type Identifier LPAREN ArgumentList RPAREN LBRACE VarDeclarationList StatementList RETURN Expression SEMI RBRACE  */
#line 190 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
        { 
		(yyval.MethodDeclaration) = new CMethod( (yyvsp[-11].Type), (yyvsp[-2].Expression), (yyvsp[-10].Identifier), (yyvsp[-8].ArgumentList), (CFieldList *)(yyvsp[-5].VarDeclarationList), (CCompoundStm *)(yyvsp[-4].Statement), false );
	}
#line 1711 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 11: /* MethodDeclarationList: %empty  */
#line 196 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
               { 
		(yyval.MethodDeclarationList) = new CMethodList();
	}
#line 1719 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 12: /* MethodDeclarationList: MethodDeclarationList MethodDeclaration  */
#line 200 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                                { 
		(yyval.MethodDeclarationList) = (yyvsp[-1].MethodDeclarationList); (yyvsp[-1].MethodDeclarationList)->Add((yyvsp[0].MethodDeclaration));
	}
#line 1727 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 13: /* VarDeclaration: Type Identifier SEMI  */
#line 206 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                             {
	    (yyvsp[-1].Identifier)->isInstance = true;
		(yyval.VarDeclaration) = new CField( (yyvsp[-2].Type), (yyvsp[-1].Identifier) );
	}
#line 1736 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 14: /* VarDeclarationList: %empty  */
#line 213 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
               { 
		(yyval.VarDeclarationList) = new CFieldList();
	}
#line 1744 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 15: /* VarDeclarationList: VarDeclarationList VarDeclaration  */
#line 217 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                          {
		(yyval.VarDeclarationList) = (yyvsp[-1].VarDeclarationList); (yyvsp[-1].VarDeclarationList)->Add( (yyvsp[0].VarDeclaration) );
	}
#line 1752 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 16: /* Argument: Type Identifier  */
#line 223 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                        {
	    (yyvsp[0].Identifier)->isInstance = true;
		(yyval.Argument) = new CArgument( (yyvsp[-1].Type), (yyvsp[0].Identifier) );
	}
#line 1761 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 17: /* Type: INT_ARRAY  */
#line 230 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                  { 
		auto p = (yyval.Type) = new CType( enums::TPrimitiveType::INT_ARRAY );
		SAVE_LOCATION
	}
#line 1770 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 18: /* Type: BOOLEAN  */
#line 235 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                { 
	    auto p = (yyval.Type) = new CType( enums::TPrimitiveType::BOOLEAN );
		SAVE_LOCATION
	}
#line 1779 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 19: /* Type: INT  */
#line 240 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
            { 
		auto p = (yyval.Type) = new CType( enums::TPrimitiveType::INT );
		SAVE_LOCATION
	}
#line 1788 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 20: /* Type: Identifier  */
#line 245 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                   { (yyval.Type) = new CType( (yyvsp[0].Identifier) ); }
#line 1794 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 21: /* NonEmptyArgumentList: Argument  */
#line 248 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                 { (yyval.NonEmptyArgumentList) = new CArgumentList((yyvsp[0].Argument)); }
#line 1800 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 22: /* NonEmptyArgumentList: NonEmptyArgumentList COMMA Argument  */
#line 250 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                            { (yyval.NonEmptyArgumentList) = (yyvsp[-2].NonEmptyArgumentList); (yyvsp[-2].NonEmptyArgumentList)->Add((yyvsp[0].Argument)); }
#line 1806 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 23: /* ArgumentList: %empty  */
#line 254 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
               { (yyval.ArgumentList) = new CArgumentList(); }
#line 1812 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 24: /* ArgumentList: NonEmptyArgumentList  */
#line 256 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                             { (yyval.ArgumentList) = (yyvsp[0].NonEmptyArgumentList); }
#line 1818 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 25: /* StatementList: %empty  */
#line 260 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
               {(yyval.Statement) = new CCompoundStm( 0, 0 ); }
#line 1824 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 26: /* StatementList: Statement StatementList  */
#line 262 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                { (yyval.Statement) = new CCompoundStm((yyvsp[-1].Statement), (yyvsp[0].Statement));  }
#line 1830 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 27: /* Statement: LBRACE StatementList RBRACE  */
#line 266 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                    { (yyval.Statement) = (yyvsp[-1].Statement); }
#line 1836 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 28: /* Statement: IF LPAREN Expression RPAREN Statement ELSE Statement  */
#line 268 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                                             { (yyval.Statement) = new CIfStm( (yyvsp[-4].Expression), (yyvsp[-2].Statement), (yyvsp[0].Statement) );  }
#line 1842 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 29: /* Statement: WHILE LPAREN Expression RPAREN Statement  */
#line 270 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                                 { (yyval.Statement) = new CWhileStm( (yyvsp[-2].Expression), (yyvsp[0].Statement) );  }
#line 1848 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 30: /* Statement: PRINTLN LPAREN Expression RPAREN SEMI  */
#line 272 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                              { (yyval.Statement) = new CPrintStm( (yyvsp[-2].Expression) ); }
#line 1854 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 31: /* Statement: Identifier ASSIGN Expression SEMI  */
#line 274 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                          { (yyvsp[-3].Identifier)->isInstance = true; (yyval.Statement) = new CAssignStm( (yyvsp[-3].Identifier), (yyvsp[-1].Expression) );  }
#line 1860 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 32: /* Statement: Identifier LBRACKET Expression RBRACKET ASSIGN Expression SEMI  */
#line 276 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                                                       { (yyvsp[-6].Identifier)->isInstance = true; (yyval.Statement) = new CAssignSubscriptStm( (yyvsp[-6].Identifier), (yyvsp[-4].Expression), (yyvsp[-1].Expression) );  }
#line 1866 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 33: /* Expression: Expression PLUS Expression  */
#line 280 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                   { (yyval.Expression) = new COpExp( (yyvsp[-2].Expression), (yyvsp[0].Expression), enums::TOperation::PLUS );  }
#line 1872 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 34: /* Expression: Expression MINUS Expression  */
#line 282 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                    { (yyval.Expression) = new COpExp( (yyvsp[-2].Expression), (yyvsp[0].Expression), enums::TOperation::MINUS );  }
#line 1878 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 35: /* Expression: Expression TIMES Expression  */
#line 284 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                    { (yyval.Expression) = new COpExp( (yyvsp[-2].Expression), (yyvsp[0].Expression), enums::TOperation::MULTIPLY );  }
#line 1884 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 36: /* Expression: Expression AND Expression  */
#line 286 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                  { (yyval.Expression) = new CLogOpExp( (yyvsp[-2].Expression), (yyvsp[0].Expression), enums::TLogicalOperation::AND );  }
#line 1890 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 37: /* Expression: Expression OR Expression  */
#line 288 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                 { (yyval.Expression) = new CLogOpExp( (yyvsp[-2].Expression), (yyvsp[0].Expression), enums::TLogicalOperation::OR );  }
#line 1896 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 38: /* Expression: Expression LESS Expression  */
#line 290 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                   { (yyval.Expression) = new CCompExp( (yyvsp[-2].Expression), (yyvsp[0].Expression), enums::TCompareOperation::LESS );  }
#line 1902 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 39: /* Expression: Expression GREATER Expression  */
#line 292 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                      { (yyval.Expression) = new CCompExp( (yyvsp[-2].Expression), (yyvsp[0].Expression), enums::TCompareOperation::GREATER );  }
#line 1908 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 40: /* Expression: Expression MOD Expression  */
#line 294 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                  { (yyval.Expression) = new COpExp( (yyvsp[-2].Expression), (yyvsp[0].Expression), enums::TOperation::MOD );  }
#line 1914 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 41: /* Expression: Expression LBRACKET Expression RBRACKET  */
#line 296 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                                { (yyval.Expression) = new CByIndexExpression((yyvsp[-3].Expression), (yyvsp[-1].Expression));  }
#line 1920 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 42: /* Expression: Expression DOT LENGTH  */
#line 298 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                              { (yyval.Expression) = new CGetLengthExp( (yyvsp[-2].Expression) );  }
#line 1926 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 43: /* Expression: Expression DOT Identifier LPAREN ExpressionList RPAREN  */
#line 300 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                                               { (yyval.Expression) = new CCallMethodExp( (yyvsp[-5].Expression), (yyvsp[-3].Identifier), (CExpList*) (yyvsp[-1].ExpressionList)) ;  }
#line 1932 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 44: /* Expression: Expression DOT Identifier  */
#line 302 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                  { (yyvsp[0].Identifier)->isInstance = true; (yyval.Expression) = new CGetFieldByThisExpression( (yyvsp[0].Identifier) ); }
#line 1938 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 45: /* Expression: MINUS Expression  */
#line 304 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                         { (yyval.Expression) = new CUnarMinusExp( (yyvsp[0].Expression) ); }
#line 1944 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 46: /* Expression: NUM  */
#line 306 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
            { auto p = (yyval.Expression) = new CNumExp((yyvsp[0].string)); SAVE_LOCATION }
#line 1950 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 47: /* Expression: TRUE  */
#line 308 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
             { auto p = (yyval.Expression) = new CLogExp(true); SAVE_LOCATION }
#line 1956 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 48: /* Expression: FALSE  */
#line 310 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
              { auto p = (yyval.Expression) = new CLogExp(false); SAVE_LOCATION }
#line 1962 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 49: /* Expression: Identifier  */
#line 312 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                   { (yyvsp[0].Identifier)->isInstance = true; (yyval.Expression) = (yyvsp[0].Identifier); }
#line 1968 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 50: /* Expression: NEW INT LBRACKET Expression RBRACKET  */
#line 314 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                             { (yyval.Expression) = new CNewArrayExpression((yyvsp[-1].Expression));  }
#line 1974 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 51: /* Expression: NEW Identifier LPAREN RPAREN  */
#line 316 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                      { (yyval.Expression) = new CNewIdentifier( (yyvsp[-2].Identifier) );  }
#line 1980 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 52: /* Expression: LPAREN Expression RPAREN  */
#line 318 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                 { (yyval.Expression) = (yyvsp[-1].Expression); }
#line 1986 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 53: /* Expression: THIS  */
#line 320 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
             { auto p = (yyval.Expression) = new CThisExpression(); SAVE_LOCATION }
#line 1992 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 54: /* Expression: NOT Expression  */
#line 322 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                       { (yyval.Expression) = new CNegativeExpression((yyvsp[0].Expression));  }
#line 1998 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 55: /* NonEmptyExpressionList: Expression  */
#line 326 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                   { (yyval.NonEmptyExpressionList) = new CExpList((yyvsp[0].Expression));  }
#line 2004 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 56: /* NonEmptyExpressionList: NonEmptyExpressionList COMMA Expression  */
#line 328 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                                                { (yyval.NonEmptyExpressionList) = (yyvsp[-2].NonEmptyExpressionList); (yyvsp[-2].NonEmptyExpressionList)->Add((yyvsp[0].Expression)); }
#line 2010 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 57: /* ExpressionList: %empty  */
#line 332 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
               { (yyval.ExpressionList) = new CExpList();  }
#line 2016 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 58: /* ExpressionList: NonEmptyExpressionList  */
#line 334 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
                               { (yyval.ExpressionList) = (yyvsp[0].NonEmptyExpressionList); }
#line 2022 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;

  case 59: /* Identifier: ID  */
#line 338 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/grammatic.bizon"
           { auto p = (yyval.Identifier) = new CIdExp( (yyvsp[0].string) ); SAVE_LOCATION }
#line 2028 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"
    break;


#line 2032 "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/bison.cpp"

      default: break;
    }
  /* User semantic actions sometimes alter yychar, and that requires
     that yytoken be updated with the new translation.  We take the
     approach of translating immediately before every use of yytoken.
     One alternative is translating here after every semantic action,
     but that translation would be missed if the semantic action invokes
     YYABORT, YYACCEPT, or YYERROR immediately after altering yychar or
     if it invokes YYBACKUP.  In the case of YYABORT or YYACCEPT, an
     incorrect destructor might then be invoked immediately.  In the
     case of YYERROR or YYBACKUP, subsequent parser actions might lead
     to an incorrect destructor call or verbose syntax error message
     before the lookahead is translated.  */
  YY_SYMBOL_PRINT ("-> $$ =", YY_CAST (yysymbol_kind_t, yyr1[yyn]), &yyval, &yyloc);

  YYPOPSTACK (yylen);
  yylen = 0;

  *++yyvsp = yyval;
  *++yylsp = yyloc;

  /* Now 'shift' the result of the reduction.  Determine what state
     that goes to, based on the state we popped back to and the rule
     number reduced by.  */
  {
    const int yylhs = yyr1[yyn] - YYNTOKENS;
    const int yyi = yypgoto[yylhs] + *yyssp;
    yystate = (0 <= yyi && yyi <= YYLAST && yycheck[yyi] == *yyssp
               ? yytable[yyi]
               : yydefgoto[yylhs]);
  }

  goto yynewstate;


/*--------------------------------------.
| yyerrlab -- here on detecting error.  |
`--------------------------------------*/
yyerrlab:
  /* Make sure we have latest lookahead translation.  See comments at
     user semantic actions for why this is necessary.  */
  yytoken = yychar == YYEMPTY ? YYSYMBOL_YYEMPTY : YYTRANSLATE (yychar);
  /* If not already recovering from an error, report this error.  */
  if (!yyerrstatus)
    {
      ++yynerrs;
      {
        yypcontext_t yyctx
          = {yyssp, yytoken, &yylloc};
        char const *yymsgp = YY_("syntax error");
        int yysyntax_error_status;
        yysyntax_error_status = yysyntax_error (&yymsg_alloc, &yymsg, &yyctx);
        if (yysyntax_error_status == 0)
          yymsgp = yymsg;
        else if (yysyntax_error_status == -1)
          {
            if (yymsg != yymsgbuf)
              YYSTACK_FREE (yymsg);
            yymsg = YY_CAST (char *,
                             YYSTACK_ALLOC (YY_CAST (YYSIZE_T, yymsg_alloc)));
            if (yymsg)
              {
                yysyntax_error_status
                  = yysyntax_error (&yymsg_alloc, &yymsg, &yyctx);
                yymsgp = yymsg;
              }
            else
              {
                yymsg = yymsgbuf;
                yymsg_alloc = sizeof yymsgbuf;
                yysyntax_error_status = YYENOMEM;
              }
          }
        yyerror (program, yymsgp);
        if (yysyntax_error_status == YYENOMEM)
          YYNOMEM;
      }
    }

  yyerror_range[1] = yylloc;
  if (yyerrstatus == 3)
    {
      /* If just tried and failed to reuse lookahead token after an
         error, discard it.  */

      if (yychar <= YYEOF)
        {
          /* Return failure if at end of input.  */
          if (yychar == YYEOF)
            YYABORT;
        }
      else
        {
          yydestruct ("Error: discarding",
                      yytoken, &yylval, &yylloc, program);
          yychar = YYEMPTY;
        }
    }

  /* Else will try to reuse lookahead token after shifting the error
     token.  */
  goto yyerrlab1;


/*---------------------------------------------------.
| yyerrorlab -- error raised explicitly by YYERROR.  |
`---------------------------------------------------*/
yyerrorlab:
  /* Pacify compilers when the user code never invokes YYERROR and the
     label yyerrorlab therefore never appears in user code.  */
  if (0)
    YYERROR;
  ++yynerrs;

  /* Do not reclaim the symbols of the rule whose action triggered
     this YYERROR.  */
  YYPOPSTACK (yylen);
  yylen = 0;
  YY_STACK_PRINT (yyss, yyssp);
  yystate = *yyssp;
  goto yyerrlab1;


/*-------------------------------------------------------------.
| yyerrlab1 -- common code for both syntax error and YYERROR.  |
`-------------------------------------------------------------*/
yyerrlab1:
  yyerrstatus = 3;      /* Each real token shifted decrements this.  */

  /* Pop stack until we find a state that shifts the error token.  */
  for (;;)
    {
      yyn = yypact[yystate];
      if (!yypact_value_is_default (yyn))
        {
          yyn += YYSYMBOL_YYerror;
          if (0 <= yyn && yyn <= YYLAST && yycheck[yyn] == YYSYMBOL_YYerror)
            {
              yyn = yytable[yyn];
              if (0 < yyn)
                break;
            }
        }

      /* Pop the current state because it cannot handle the error token.  */
      if (yyssp == yyss)
        YYABORT;

      yyerror_range[1] = *yylsp;
      yydestruct ("Error: popping",
                  YY_ACCESSING_SYMBOL (yystate), yyvsp, yylsp, program);
      YYPOPSTACK (1);
      yystate = *yyssp;
      YY_STACK_PRINT (yyss, yyssp);
    }

  YY_IGNORE_MAYBE_UNINITIALIZED_BEGIN
  *++yyvsp = yylval;
  YY_IGNORE_MAYBE_UNINITIALIZED_END

  yyerror_range[2] = yylloc;
  ++yylsp;
  YYLLOC_DEFAULT (*yylsp, yyerror_range, 2);

  /* Shift the error token.  */
  YY_SYMBOL_PRINT ("Shifting", YY_ACCESSING_SYMBOL (yyn), yyvsp, yylsp);

  yystate = yyn;
  goto yynewstate;


/*-------------------------------------.
| yyacceptlab -- YYACCEPT comes here.  |
`-------------------------------------*/
yyacceptlab:
  yyresult = 0;
  goto yyreturnlab;


/*-----------------------------------.
| yyabortlab -- YYABORT comes here.  |
`-----------------------------------*/
yyabortlab:
  yyresult = 1;
  goto yyreturnlab;


/*-----------------------------------------------------------.
| yyexhaustedlab -- YYNOMEM (memory exhaustion) comes here.  |
`-----------------------------------------------------------*/
yyexhaustedlab:
  yyerror (program, YY_("memory exhausted"));
  yyresult = 2;
  goto yyreturnlab;


/*----------------------------------------------------------.
| yyreturnlab -- parsing is finished, clean up and return.  |
`----------------------------------------------------------*/
yyreturnlab:
  if (yychar != YYEMPTY)
    {
      /* Make sure we have latest lookahead translation.  See comments at
         user semantic actions for why this is necessary.  */
      yytoken = YYTRANSLATE (yychar);
      yydestruct ("Cleanup: discarding lookahead",
                  yytoken, &yylval, &yylloc, program);
    }
  /* Do not reclaim the symbols of the rule whose action triggered
     this YYABORT or YYACCEPT.  */
  YYPOPSTACK (yylen);
  YY_STACK_PRINT (yyss, yyssp);
  while (yyssp != yyss)
    {
      yydestruct ("Cleanup: popping",
                  YY_ACCESSING_SYMBOL (+*yyssp), yyvsp, yylsp, program);
      YYPOPSTACK (1);
    }
#ifndef yyoverflow
  if (yyss != yyssa)
    YYSTACK_FREE (yyss);
#endif
  if (yymsg != yymsgbuf)
    YYSTACK_FREE (yymsg);
  return yyresult;
}